

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TParseContext::handleDotSwizzle
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *base,TString *field)

{
  TIntermediate *this_00;
  char cVar1;
  int iVar2;
  uint uVar3;
  TBasicType TVar4;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  undefined4 extraout_var_03;
  TIntermConstantUnion *index;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TSwizzleSelectors<int> selectors;
  TType type;
  undefined4 extraout_var_00;
  
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2c])(base);
  if ((char)iVar2 != '\0') {
    TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"scalar swizzle");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1a4,"GL_ARB_shading_language_420pack",
               "scalar swizzle");
  }
  selectors.size_ = 0;
  uVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x26])(base);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x44])
            (this,loc,field,(ulong)uVar3);
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2b])(base);
  if (((char)iVar2 != '\0') && (selectors.size_ != 1)) {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))
                      ((long *)CONCAT44(extraout_var,iVar2),3);
    if (cVar1 != '\0') {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                (this,loc,".","can\'t swizzle types containing float16");
    }
  }
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2b])(base);
  if (((char)iVar2 != '\0') && (selectors.size_ != 1)) {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
    cVar1 = (**(code **)(*plVar5 + 400))(plVar5,6);
    if ((cVar1 != '\0') || (cVar1 = (**(code **)(*plVar5 + 400))(plVar5,7), cVar1 != '\0')) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                (this,loc,".","can\'t swizzle types containing (u)int16");
    }
  }
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2b])(base);
  if (((char)iVar2 != '\0') && (selectors.size_ != 1)) {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    plVar5 = (long *)CONCAT44(extraout_var_01,iVar2);
    cVar1 = (**(code **)(*plVar5 + 400))(plVar5,4);
    if ((cVar1 != '\0') || (cVar1 = (**(code **)(*plVar5 + 400))(plVar5,5), cVar1 != '\0')) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                (this,loc,".","can\'t swizzle types containing (u)int8");
    }
  }
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2c])(base);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x58))
                      ((long *)CONCAT44(extraout_var_02,iVar2));
    if ((*(ulong *)(lVar6 + 8) & 0x10000007f) == 2) {
      base = TIntermediate::foldSwizzle
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,base,
                        &selectors,loc);
    }
    else {
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (selectors.size_ == 1) {
        index = TIntermediate::addConstantUnion(this_00,selectors.components[0],loc,false);
        pTVar7 = TIntermediate::addIndex
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            EOpIndexDirect,base,&index->super_TIntermTyped,loc);
        TVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base);
        iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
        lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x58))
                          ((long *)CONCAT44(extraout_var_04,iVar2));
        uVar3 = *(uint *)(lVar6 + 8);
        iVar2 = 1;
      }
      else {
        pTVar7 = TIntermediate::addSwizzle<int>(this_00,&selectors,loc);
        pTVar7 = TIntermediate::addIndex
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            EOpVectorSwizzle,base,pTVar7,loc);
        TVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base);
        iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
        lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x58))
                          ((long *)CONCAT44(extraout_var_05,iVar2));
        uVar3 = *(uint *)(lVar6 + 8);
        iVar2 = selectors.size_;
      }
      TType::TType(&type,TVar4,EvqTemporary,uVar3 >> 0x19 & 7,iVar2,0,0,false);
      (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar7,&type);
      iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x58))
                        ((long *)CONCAT44(extraout_var_06,iVar2));
      base = pTVar7;
      if ((*(ulong *)(lVar6 + 8) & 0x100000000) != 0) {
        iVar2 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar7);
        lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar2) + 0x50))
                          ((long *)CONCAT44(extraout_var_07,iVar2));
        *(ulong *)(lVar6 + 8) = (*(ulong *)(lVar6 + 8) & 0xfffffffeffffff80) + 0x100000002;
      }
    }
  }
  else if (selectors.size_ != 1) {
    TVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base);
    TType::TType(&type,TVar4,EvqTemporary,selectors.size_,0,0,false);
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])(base);
    if ((*(byte *)(CONCAT44(extraout_var_03,iVar2) + 0xc) & 1) != 0) {
      type.qualifier._8_8_ = (type.qualifier._8_8_ & 0xfffffffeffffff80) + 0x100000002;
    }
    base = addConstructor(this,loc,&base->super_TIntermNode,&type);
  }
  return base;
}

Assistant:

TIntermTyped* TParseContext::handleDotSwizzle(const TSourceLoc& loc, TIntermTyped* base, const TString& field)
{
    TIntermTyped* result = base;
    if (base->isScalar()) {
        const char* dotFeature = "scalar swizzle";
        requireProfile(loc, ~EEsProfile, dotFeature);
        profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, dotFeature);
    }

    TSwizzleSelectors<TVectorSelector> selectors;
    parseSwizzleSelector(loc, field, base->getVectorSize(), selectors);

    if (base->isVector() && selectors.size() != 1 && base->getType().contains16BitFloat())
        requireFloat16Arithmetic(loc, ".", "can't swizzle types containing float16");
    if (base->isVector() && selectors.size() != 1 && base->getType().contains16BitInt())
        requireInt16Arithmetic(loc, ".", "can't swizzle types containing (u)int16");
    if (base->isVector() && selectors.size() != 1 && base->getType().contains8BitInt())
        requireInt8Arithmetic(loc, ".", "can't swizzle types containing (u)int8");

    if (base->isScalar()) {
        if (selectors.size() == 1)
            return result;
        else {
            TType type(base->getBasicType(), EvqTemporary, selectors.size());
            // Swizzle operations propagate specialization-constantness
            if (base->getQualifier().isSpecConstant())
                type.getQualifier().makeSpecConstant();
            return addConstructor(loc, base, type);
        }
    }

    if (base->getType().getQualifier().isFrontEndConstant())
        result = intermediate.foldSwizzle(base, selectors, loc);
    else {
        if (selectors.size() == 1) {
            TIntermTyped* index = intermediate.addConstantUnion(selectors[0], loc);
            result = intermediate.addIndex(EOpIndexDirect, base, index, loc);
            result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision));
        } else {
            TIntermTyped* index = intermediate.addSwizzle(selectors, loc);
            result = intermediate.addIndex(EOpVectorSwizzle, base, index, loc);
            result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision, selectors.size()));
        }
        // Swizzle operations propagate specialization-constantness
        if (base->getType().getQualifier().isSpecConstant())
            result->getWritableType().getQualifier().makeSpecConstant();
    }

    return result;
}